

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.h
# Opt level: O2

VarSet * __thiscall libDAI::IJGP::Bucket::vars(VarSet *__return_storage_ptr__,Bucket *this)

{
  pointer pBVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  (__return_storage_ptr__->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = 0;
  (__return_storage_ptr__->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->_statespace = 1;
  for (uVar2 = 0;
      pBVar1 = (this->
               super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>).
               super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(this->
                             super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                             ).
                             super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) / 0x30);
      uVar2 = uVar2 + 1) {
    VarSet::operator|=(__return_storage_ptr__,
                       (VarSet *)((long)&(pBVar1->super_VarSet)._vars + lVar3));
    lVar3 = lVar3 + 0x30;
  }
  return __return_storage_ptr__;
}

Assistant:

VarSet vars() {
                        VarSet result;
                        for( size_t i = 0; i < size(); i++ )
                            result |= operator[](i);
                        return result;
                    }